

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

int sam_hdr_update(SAM_hdr *hdr,SAM_hdr_type *type,...)

{
  string_alloc_t *a_str;
  char in_AL;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_148;
  undefined8 *local_130;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  SAM_hdr_tag *local_60;
  SAM_hdr_tag *prev;
  SAM_hdr_tag *tag;
  undefined8 uStack_48;
  int idx;
  char *v;
  char *k;
  va_list ap;
  SAM_hdr_type *type_local;
  SAM_hdr *hdr_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_118;
  ap[0]._0_8_ = &stack0x00000008;
  k._4_4_ = 0x30;
  k._0_4_ = 0x10;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  ap[0].reg_save_area = type;
  while( true ) {
    if ((uint)k < 0x29) {
      local_130 = (undefined8 *)((long)(int)(uint)k + (long)ap[0].overflow_arg_area);
      k._0_4_ = (uint)k + 8;
    }
    else {
      local_130 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    v = (char *)*local_130;
    if (v == (char *)0x0) {
      return 0;
    }
    if ((uint)k < 0x29) {
      local_148 = (undefined8 *)((long)(int)(uint)k + (long)ap[0].overflow_arg_area);
      k._0_4_ = (uint)k + 8;
    }
    else {
      local_148 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    uStack_48 = *local_148;
    prev = sam_hdr_find_key(hdr,(SAM_hdr_type *)ap[0].reg_save_area,v,&local_60);
    if (prev == (SAM_hdr_tag *)0x0) {
      prev = (SAM_hdr_tag *)pool_alloc(hdr->tag_pool);
      if (prev == (SAM_hdr_tag *)0x0) {
        return -1;
      }
      if (local_60 == (SAM_hdr_tag *)0x0) {
        *(SAM_hdr_tag **)((long)ap[0].reg_save_area + 0x10) = prev;
      }
      else {
        local_60->next = prev;
      }
      prev->next = (SAM_hdr_tag_s *)0x0;
    }
    sVar2 = ks_len(&hdr->text);
    tag._4_4_ = (int)sVar2;
    iVar1 = ksprintf(&hdr->text,"%2.2s:%s",v,uStack_48);
    if (iVar1 < 0) break;
    sVar2 = ks_len(&hdr->text);
    prev->len = (int)sVar2 - tag._4_4_;
    a_str = hdr->str_pool;
    pcVar3 = ks_str(&hdr->text);
    pcVar3 = string_ndup(a_str,pcVar3 + tag._4_4_,(long)prev->len);
    prev->str = pcVar3;
    if (prev->str == (char *)0x0) {
      return -1;
    }
  }
  return -1;
}

Assistant:

int sam_hdr_update(SAM_hdr *hdr, SAM_hdr_type *type, ...) {
    va_list ap;

    va_start(ap, type);
    
    for (;;) {
	char *k, *v;
	int idx;
	SAM_hdr_tag *tag, *prev;

	if (!(k = (char *)va_arg(ap, char *)))
	    break;
	v = va_arg(ap, char *);

	tag = sam_hdr_find_key(hdr, type, k, &prev);
	if (!tag) {
	    if (!(tag = pool_alloc(hdr->tag_pool)))
		return -1;
	    if (prev)
		prev->next = tag;
	    else
		type->tag = tag;

	    tag->next = NULL;
	}

	idx = ks_len(&hdr->text);
	if (ksprintf(&hdr->text, "%2.2s:%s", k, v) < 0)
	    return -1;
	tag->len = ks_len(&hdr->text) - idx;
	tag->str = string_ndup(hdr->str_pool,
			       ks_str(&hdr->text) + idx,
			       tag->len);
	if (!tag->str)
	    return -1;
    }

    va_end(ap);

    return 0;
}